

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# print.h
# Opt level: O0

void pbrt::detail::
     stringPrintfRecursive<pbrt::Point3fi_const&,pbrt::Normal3<float>const&,pbrt::Point2<float>const&,pbrt::Vector3<float>const&,float_const&,char_const*,char_const*,pbrt::Vector3<float>const&,pbrt::Vector3<float>const&,pbrt::Normal3<float>const&,pbrt::Normal3<float>const&,pbrt::Normal3<float>const&,pbrt::Vector3<float>const&,pbrt::Vector3<float>const&,pbrt::Normal3<float>const&,pbrt::Normal3<float>const&,char_const*,char_const*,pbrt::Vector3<float>const&,pbrt::Vector3<float>const&,float_const&,float_const&,float_const&,float_const&,int_const&>
               (string *s,char *fmt,Point3fi *v,Normal3<float> *args,Point2<float> *args_1,
               Vector3<float> *args_2,float *args_3,char **args_4,char **args_5,
               Vector3<float> *args_6,Vector3<float> *args_7,Normal3<float> *args_8,
               Normal3<float> *args_9,Normal3<float> *args_10,Vector3<float> *args_11,
               Vector3<float> *args_12,Normal3<float> *args_13,Normal3<float> *args_14,
               char **args_15,char **args_16,Vector3<float> *args_17,Vector3<float> *args_18,
               float *args_19,float *args_20,float *args_21,float *args_22,int *args_23)

{
  long lVar1;
  ulong uVar2;
  string *in_RCX;
  char **unaff_RBP;
  string *in_RDI;
  char *in_R8;
  Normal3<float> *in_R9;
  char **unaff_R15;
  Vector3<float> *unaff_retaddr;
  Vector3<float> *in_stack_00000008;
  Normal3<float> *in_stack_00000010;
  Normal3<float> *in_stack_00000018;
  Normal3<float> *in_stack_00000020;
  Vector3<float> *in_stack_00000028;
  Vector3<float> *in_stack_00000030;
  Normal3<float> *in_stack_00000038;
  Normal3<float> *in_stack_00000040;
  char **in_stack_00000048;
  char **in_stack_00000050;
  Vector3<float> *in_stack_00000058;
  Vector3<float> *in_stack_00000060;
  float *in_stack_00000068;
  float *in_stack_00000070;
  float *in_stack_00000078;
  float *in_stack_00000080;
  int *in_stack_00000088;
  stringstream ss;
  bool isDFmt;
  bool isSFmt;
  bool precisionViaArg;
  string nextFmt;
  Point3fi *in_stack_fffffffffffffc70;
  char *in_stack_fffffffffffffc78;
  string *in_stack_fffffffffffffc90;
  char **in_stack_fffffffffffffc98;
  char **in_stack_fffffffffffffca0;
  Point3fi *in_stack_fffffffffffffca8;
  ostream *in_stack_fffffffffffffcb0;
  char *in_stack_fffffffffffffd18;
  undefined8 in_stack_fffffffffffffd20;
  int line;
  char *in_stack_fffffffffffffd28;
  undefined8 in_stack_fffffffffffffd30;
  LogLevel level;
  string local_288 [32];
  string local_268 [32];
  undefined8 local_248;
  string local_240 [32];
  stringstream local_220 [413];
  undefined1 local_83;
  byte local_82;
  byte local_81;
  string local_80 [8];
  float *in_stack_ffffffffffffff88;
  Vector3<float> *in_stack_ffffffffffffff90;
  Point2<float> *in_stack_ffffffffffffff98;
  
  level = (LogLevel)((ulong)in_stack_fffffffffffffd30 >> 0x20);
  line = (int)((ulong)in_stack_fffffffffffffd20 >> 0x20);
  copyToFormatString(in_stack_fffffffffffffc98,in_stack_fffffffffffffc90);
  lVar1 = std::__cxx11::string::find((char)local_80,0x2a);
  local_81 = lVar1 != -1;
  lVar1 = std::__cxx11::string::find((char)local_80,0x73);
  local_82 = lVar1 != -1;
  lVar1 = std::__cxx11::string::find((char)local_80,100);
  local_83 = lVar1 != -1;
  if ((local_81 & 1) != 0) {
    LogFatal(level,in_stack_fffffffffffffd28,line,in_stack_fffffffffffffd18);
  }
  if ((bool)local_83) {
    LogFatal(level,in_stack_fffffffffffffd28,line,in_stack_fffffffffffffd18);
  }
  if ((local_82 & 1) == 0) {
    uVar2 = std::__cxx11::string::empty();
    if ((uVar2 & 1) != 0) {
      LogFatal(level,in_stack_fffffffffffffd28,line,in_stack_fffffffffffffd18);
    }
    std::__cxx11::string::c_str();
    formatOne<pbrt::Point3fi_const&>(in_stack_fffffffffffffc78,in_stack_fffffffffffffc70);
    std::__cxx11::string::operator+=(in_RDI,local_288);
    std::__cxx11::string::~string(local_288);
  }
  else {
    std::__cxx11::stringstream::stringstream(local_220);
    pbrt::operator<<(in_stack_fffffffffffffcb0,in_stack_fffffffffffffca8);
    std::__cxx11::string::c_str();
    std::__cxx11::stringstream::str();
    local_248 = std::__cxx11::string::c_str();
    formatOne<char_const*>((char *)in_stack_fffffffffffffca8,in_stack_fffffffffffffca0);
    std::__cxx11::string::operator+=(in_RDI,local_240);
    std::__cxx11::string::~string(local_240);
    std::__cxx11::string::~string(local_268);
    std::__cxx11::stringstream::~stringstream(local_220);
  }
  stringPrintfRecursive<pbrt::Normal3<float>const&,pbrt::Point2<float>const&,pbrt::Vector3<float>const&,float_const&,char_const*,char_const*,pbrt::Vector3<float>const&,pbrt::Vector3<float>const&,pbrt::Normal3<float>const&,pbrt::Normal3<float>const&,pbrt::Normal3<float>const&,pbrt::Vector3<float>const&,pbrt::Vector3<float>const&,pbrt::Normal3<float>const&,pbrt::Normal3<float>const&,char_const*,char_const*,pbrt::Vector3<float>const&,pbrt::Vector3<float>const&,float_const&,float_const&,float_const&,float_const&,int_const&>
            (in_RCX,in_R8,in_R9,in_stack_ffffffffffffff98,in_stack_ffffffffffffff90,
             in_stack_ffffffffffffff88,unaff_R15,unaff_RBP,unaff_retaddr,in_stack_00000008,
             in_stack_00000010,in_stack_00000018,in_stack_00000020,in_stack_00000028,
             in_stack_00000030,in_stack_00000038,in_stack_00000040,in_stack_00000048,
             in_stack_00000050,in_stack_00000058,in_stack_00000060,in_stack_00000068,
             in_stack_00000070,in_stack_00000078,in_stack_00000080,in_stack_00000088);
  std::__cxx11::string::~string(local_80);
  return;
}

Assistant:

inline void stringPrintfRecursive(std::string *s, const char *fmt, T &&v,
                                  Args &&...args) {
    std::string nextFmt = copyToFormatString(&fmt, s);
    bool precisionViaArg = nextFmt.find('*') != std::string::npos;

    bool isSFmt = nextFmt.find('s') != std::string::npos;
    bool isDFmt = nextFmt.find('d') != std::string::npos;

    if constexpr (std::is_integral_v<std::decay_t<T>>) {
        if (precisionViaArg) {
            stringPrintfRecursiveWithPrecision(s, fmt, nextFmt, v,
                                               std::forward<Args>(args)...);
            return;
        }
    } else if (precisionViaArg)
        LOG_FATAL("Non-integral type provided for %* format.");

    if constexpr (std::is_same_v<std::decay_t<T>, float>)
        if (nextFmt == "%f" || nextFmt == "%s") {
            *s += detail::FloatToString(v);
            goto done;
        }

    if constexpr (std::is_same_v<std::decay_t<T>, double>)
        if (nextFmt == "%f" || nextFmt == "%s") {
            *s += detail::DoubleToString(v);
            goto done;
        }

    if constexpr (std::is_same_v<std::decay_t<T>, bool>)  // FIXME: %-10s with bool
        if (isSFmt) {
            *s += bool(v) ? "true" : "false";
            goto done;
        }

    if constexpr (std::is_integral_v<std::decay_t<T>>) {
        if (isDFmt) {
            nextFmt.replace(nextFmt.find('d'), 1,
                            detail::IntegerFormatTrait<std::decay_t<T>>::fmt());
            *s += formatOne(nextFmt.c_str(), std::forward<T>(v));
            goto done;
        }
    } else if (isDFmt)
        LOG_FATAL("Non-integral type passed to %d format.");

    if (isSFmt) {
        std::stringstream ss;
        ss << v;
        *s += formatOne(nextFmt.c_str(), ss.str().c_str());
    } else if (!nextFmt.empty())
        *s += formatOne(nextFmt.c_str(), std::forward<T>(v));
    else
        LOG_FATAL("Excess values passed to Printf.");

done:
    stringPrintfRecursive(s, fmt, std::forward<Args>(args)...);
}